

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

void Ivy_ManCutTruthOne(Ivy_Man_t *p,Ivy_Obj_t *pNode,Vec_Int_t *vTruth,int nWords)

{
  int iVar1;
  uint *puVar2;
  Ivy_Obj_t *pIVar3;
  uint *puVar4;
  uint *puVar5;
  int local_44;
  int i;
  uint *pTruth1;
  uint *pTruth0;
  uint *pTruth;
  int nWords_local;
  Vec_Int_t *vTruth_local;
  Ivy_Obj_t *pNode_local;
  Ivy_Man_t *p_local;
  
  puVar2 = Ivy_ObjGetTruthStore(pNode->TravId,vTruth);
  pIVar3 = Ivy_ObjFanin0(pNode);
  puVar4 = Ivy_ObjGetTruthStore(pIVar3->TravId,vTruth);
  pIVar3 = Ivy_ObjFanin1(pNode);
  puVar5 = Ivy_ObjGetTruthStore(pIVar3->TravId,vTruth);
  iVar1 = Ivy_ObjIsExor(pNode);
  if (iVar1 == 0) {
    iVar1 = Ivy_ObjFaninC0(pNode);
    if ((iVar1 == 0) && (iVar1 = Ivy_ObjFaninC1(pNode), iVar1 == 0)) {
      for (local_44 = 0; local_44 < nWords; local_44 = local_44 + 1) {
        puVar2[local_44] = puVar4[local_44] & puVar5[local_44];
      }
    }
    else {
      iVar1 = Ivy_ObjFaninC0(pNode);
      if ((iVar1 == 0) && (iVar1 = Ivy_ObjFaninC1(pNode), iVar1 != 0)) {
        for (local_44 = 0; local_44 < nWords; local_44 = local_44 + 1) {
          puVar2[local_44] = puVar4[local_44] & (puVar5[local_44] ^ 0xffffffff);
        }
      }
      else {
        iVar1 = Ivy_ObjFaninC0(pNode);
        if ((iVar1 == 0) || (iVar1 = Ivy_ObjFaninC1(pNode), iVar1 != 0)) {
          for (local_44 = 0; local_44 < nWords; local_44 = local_44 + 1) {
            puVar2[local_44] = (puVar4[local_44] ^ 0xffffffff) & (puVar5[local_44] ^ 0xffffffff);
          }
        }
        else {
          for (local_44 = 0; local_44 < nWords; local_44 = local_44 + 1) {
            puVar2[local_44] = (puVar4[local_44] ^ 0xffffffff) & puVar5[local_44];
          }
        }
      }
    }
  }
  else {
    for (local_44 = 0; local_44 < nWords; local_44 = local_44 + 1) {
      puVar2[local_44] = puVar4[local_44] ^ puVar5[local_44];
    }
  }
  return;
}

Assistant:

void Ivy_ManCutTruthOne( Ivy_Man_t * p, Ivy_Obj_t * pNode, Vec_Int_t * vTruth, int nWords )
{
    unsigned * pTruth, * pTruth0, * pTruth1;
    int i;
    pTruth  = Ivy_ObjGetTruthStore( pNode->TravId, vTruth );
    pTruth0 = Ivy_ObjGetTruthStore( Ivy_ObjFanin0(pNode)->TravId, vTruth );
    pTruth1 = Ivy_ObjGetTruthStore( Ivy_ObjFanin1(pNode)->TravId, vTruth );
    if ( Ivy_ObjIsExor(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Ivy_ObjFaninC0(pNode) && !Ivy_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Ivy_ObjFaninC0(pNode) && Ivy_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Ivy_ObjFaninC0(pNode) && !Ivy_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Ivy_ObjFaninC0(pNode) && Ivy_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
}